

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.h
# Opt level: O0

RegEx * YAML::Exp::Chomp(void)

{
  int iVar1;
  RegEx *ex1;
  RegEx *ex2;
  
  if (Chomp()::e == '\0') {
    iVar1 = __cxa_guard_acquire(&Chomp()::e);
    if (iVar1 != 0) {
      ex1 = ChompIndicator();
      ex2 = Digit();
      YAML::operator+(ex1,ex2);
      Digit();
      ChompIndicator();
      YAML::operator+(ex1,ex2);
      operator|(ex1,ex2);
      ChompIndicator();
      operator|(ex1,ex2);
      Digit();
      operator|(ex1,ex2);
      RegEx::~RegEx((RegEx *)0xf22bad);
      RegEx::~RegEx((RegEx *)0xf22bba);
      RegEx::~RegEx((RegEx *)0xf22bc4);
      RegEx::~RegEx((RegEx *)0xf22bce);
      __cxa_atexit(RegEx::~RegEx,&Chomp::e,&__dso_handle);
      __cxa_guard_release(&Chomp()::e);
    }
  }
  return &Chomp::e;
}

Assistant:

inline const RegEx& Chomp() {
  static const RegEx e = (ChompIndicator() + Digit()) |
                         (Digit() + ChompIndicator()) | ChompIndicator() |
                         Digit();
  return e;
}